

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTWeather.cpp
# Opt level: O2

bool __thiscall
LTWeatherVisitor::visitTemperatureGroup
          (LTWeatherVisitor *this,TemperatureGroup *tg,ReportPart param_2,string *param_3)

{
  float fVar1;
  LTWeather *pLVar2;
  _Storage<float,_true> _Var3;
  optional<float> oVar4;
  Temperature local_38;
  
  if (tg->tp == TEMPERATURE_AND_DEW_POINT) {
    local_38.tempValue.super__Optional_base<int,_true,_true>._M_payload.
    super__Optional_payload_base<int> =
         *(_Optional_base<int,_true,_true> *)
          &(tg->t).tempValue.super__Optional_base<int,_true,_true>._M_payload.
           super__Optional_payload_base<int>;
    if (((ulong)local_38.tempValue.super__Optional_base<int,_true,_true>._M_payload.
                super__Optional_payload_base<int> >> 0x20 & 1) != 0) {
      local_38.freezing = (tg->t).freezing;
      local_38.precise = (tg->t).precise;
      pLVar2 = this->w;
      fVar1 = this->fieldAlt_m;
      oVar4 = metaf::Temperature::toUnit(&local_38,C);
      if (((ulong)oVar4.super__Optional_base<float,_true,_true>._M_payload.
                  super__Optional_payload_base<float> & 0x100000000) == 0) {
        _Var3._M_value = NAN;
      }
      else {
        _Var3 = oVar4.super__Optional_base<float,_true,_true>._M_payload.
                super__Optional_payload_base<float>._M_payload;
      }
      LTWeather::FillUp(&pLVar2->temperature_altitude_msl_m,&pLVar2->temperatures_aloft_deg_c,fVar1,
                        _Var3._M_value,true);
    }
    local_38.tempValue.super__Optional_base<int,_true,_true>._M_payload.
    super__Optional_payload_base<int> =
         *(_Optional_base<int,_true,_true> *)
          &(tg->dp).tempValue.super__Optional_base<int,_true,_true>._M_payload.
           super__Optional_payload_base<int>;
    if (((ulong)local_38.tempValue.super__Optional_base<int,_true,_true>._M_payload.
                super__Optional_payload_base<int> & 0x100000000) != 0) {
      local_38.freezing = (tg->dp).freezing;
      local_38.precise = (tg->dp).precise;
      pLVar2 = this->w;
      fVar1 = this->fieldAlt_m;
      oVar4 = metaf::Temperature::toUnit(&local_38,C);
      if (((ulong)oVar4.super__Optional_base<float,_true,_true>._M_payload.
                  super__Optional_payload_base<float> & 0x100000000) == 0) {
        _Var3._M_value = NAN;
      }
      else {
        _Var3 = oVar4.super__Optional_base<float,_true,_true>._M_payload.
                super__Optional_payload_base<float>._M_payload;
      }
      LTWeather::FillUp(&pLVar2->temperature_altitude_msl_m,&pLVar2->dewpoint_deg_c,fVar1,
                        _Var3._M_value,true);
    }
  }
  return false;
}

Assistant:

bool visitTemperatureGroup(const TemperatureGroup& tg,
                               ReportPart, const std::string&) override
    {
        if (tg.type() == TemperatureGroup::Type::TEMPERATURE_AND_DEW_POINT) {
            // Temperatur: Fill the same temp all the way up to field altitude, which wouldn't be quite right...but under us is ground anyway
            if (tg.airTemperature().temperature().has_value())
                w.FillUp(w.temperature_altitude_msl_m, w.temperatures_aloft_deg_c,
                         fieldAlt_m,
                         tg.airTemperature().toUnit(Temperature::Unit::C).value_or(NAN),
                         true);
            // Dew Point: Fill the same temp all the way up to field altitude, which wouldn't be quite right...but under us is ground anyway
            if (tg.dewPoint().temperature().has_value())
                w.FillUp(w.temperature_altitude_msl_m, w.dewpoint_deg_c,
                         fieldAlt_m,
                         tg.dewPoint().toUnit(Temperature::Unit::C).value_or(NAN),
                         true);
        }
        return false;
    }